

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O0

void Sfm_TimGateArrival(Sfm_Tim_t *p,Mio_Gate_t *pGate,int **pTimesIn,int *pTimeOut)

{
  int iVar1;
  int local_34;
  Mio_Pin_t *pMStack_30;
  int i;
  Mio_Pin_t *pPin;
  int *pTimeOut_local;
  int **pTimesIn_local;
  Mio_Gate_t *pGate_local;
  Sfm_Tim_t *p_local;
  
  local_34 = 0;
  pTimeOut[1] = 0;
  *pTimeOut = 0;
  pMStack_30 = Mio_GateReadPins(pGate);
  while (pMStack_30 != (Mio_Pin_t *)0x0) {
    Sfm_TimEdgeArrival(p,pMStack_30,pTimesIn[local_34],pTimeOut);
    pMStack_30 = Mio_PinReadNext(pMStack_30);
    local_34 = local_34 + 1;
  }
  iVar1 = Mio_GateReadPinNum(pGate);
  if (local_34 == iVar1) {
    return;
  }
  __assert_fail("i == Mio_GateReadPinNum(pGate)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmTim.c"
                ,0x61,"void Sfm_TimGateArrival(Sfm_Tim_t *, Mio_Gate_t *, int **, int *)");
}

Assistant:

static inline void Sfm_TimGateArrival( Sfm_Tim_t * p, Mio_Gate_t * pGate, int ** pTimesIn, int * pTimeOut )
{
    Mio_Pin_t * pPin;  int i = 0;
    pTimeOut[0] = pTimeOut[1] = 0;
    Mio_GateForEachPin( pGate, pPin )
        Sfm_TimEdgeArrival( p, pPin, pTimesIn[i++], pTimeOut );
    assert( i == Mio_GateReadPinNum(pGate) );
}